

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O1

void free_keymap(void)

{
  free(commandlist);
  commandlist = (nh_cmd_desc *)0x0;
  cmdcount = L'\0';
  if (unknown_commands != (nh_cmd_desc *)0x0) {
    free(unknown_commands);
    unknown_commands = (nh_cmd_desc *)0x0;
    unknown_count = L'\0';
    unknown_size = L'\0';
  }
  return;
}

Assistant:

void free_keymap(void)
{
    free(commandlist);
    commandlist = NULL;
    cmdcount = 0;
    
    if (unknown_commands) {
	free(unknown_commands);
	unknown_commands = NULL;
	unknown_size = unknown_count = 0;
    }
}